

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O0

void __thiscall
flatbuffers::dart::DartGenerator::GenImplementationGetters
          (DartGenerator *this,StructDef *struct_def,
          vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
          *non_deprecated_fields,string *code)

{
  FieldDef *s;
  Namespace *pNVar1;
  bool bVar2;
  uint uVar3;
  pointer ppVar4;
  vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_> *pvVar5;
  reference ppEVar6;
  char *__rhs;
  byte local_4d1;
  string local_4c8;
  string local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  undefined1 local_3c8 [8];
  string offset;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  string local_348;
  allocator<char> local_321;
  string local_320;
  string local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  string local_2c0;
  string local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  undefined1 local_1c0 [8];
  string enum_name;
  EnumVal *ev;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_190;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_188;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  en_it;
  EnumDef *enum_def;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  allocator<char> local_d1;
  string local_d0;
  undefined1 local_b0 [8];
  string type_name;
  bool isNullable;
  undefined1 local_80 [8];
  string defaultValue;
  string field_name;
  FieldDef *field;
  __normal_iterator<const_std::pair<int,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>_>
  local_30;
  const_iterator it;
  string *code_local;
  vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
  *non_deprecated_fields_local;
  StructDef *struct_def_local;
  DartGenerator *this_local;
  
  it._M_current = (pair<int,_flatbuffers::FieldDef_*> *)code;
  local_30._M_current =
       (pair<int,_flatbuffers::FieldDef_*> *)
       std::
       vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
       ::begin(non_deprecated_fields);
  while( true ) {
    field = (FieldDef *)
            std::
            vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
            ::end(non_deprecated_fields);
    bVar2 = __gnu_cxx::operator!=
                      (&local_30,
                       (__normal_iterator<const_std::pair<int,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>_>
                        *)&field);
    if (!bVar2) break;
    ppVar4 = __gnu_cxx::
             __normal_iterator<const_std::pair<int,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>_>
             ::operator->(&local_30);
    s = ppVar4->second;
    IdlNamer::Field_abi_cxx11_((string *)((long)&defaultValue.field_2 + 8),&this->namer_,s);
    getDefaultValue_abi_cxx11_((string *)local_80,this,&s->value);
    uVar3 = std::__cxx11::string::empty();
    local_4d1 = 0;
    if ((uVar3 & 1) != 0) {
      local_4d1 = struct_def->fixed ^ 0xff;
    }
    pNVar1 = (struct_def->super_Definition).defined_namespace;
    type_name.field_2._M_local_buf[0xb] = local_4d1 & 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"",&local_d1);
    GenDartTypeName((string *)local_b0,this,&(s->value).type,pNVar1,s,(bool)(local_4d1 & 1),
                    &local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator(&local_d1);
    GenDocComment(&(s->super_Definition).doc_comment,"  ",(string *)it._M_current);
    std::operator+(&local_138,"  ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
    std::operator+(&local_118,&local_138," get ");
    std::operator+(&local_f8,&local_118,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&defaultValue.field_2 + 8));
    std::__cxx11::string::operator+=((string *)it._M_current,(string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    if ((s->value).type.base_type == BASE_TYPE_UNION) {
      std::__cxx11::string::operator+=((string *)it._M_current," {\n");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&enum_def,
                     "    switch (",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&defaultValue.field_2 + 8));
      std::operator+(&local_158,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&enum_def,
                     "Type?.value) {\n");
      std::__cxx11::string::operator+=((string *)it._M_current,(string *)&local_158);
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&enum_def);
      en_it._M_current = (EnumVal **)(s->value).type.enum_def;
      pvVar5 = EnumDef::Vals((EnumDef *)en_it._M_current);
      local_190._M_current =
           (EnumVal **)
           std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin
                     (pvVar5);
      local_188 = __gnu_cxx::
                  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                  ::operator+(&local_190,1);
      while( true ) {
        pvVar5 = EnumDef::Vals((EnumDef *)en_it._M_current);
        ev = (EnumVal *)
             std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end
                       (pvVar5);
        bVar2 = __gnu_cxx::operator!=
                          (&local_188,
                           (__normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                            *)&ev);
        if (!bVar2) break;
        ppEVar6 = __gnu_cxx::
                  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                  ::operator*(&local_188);
        enum_name.field_2._8_8_ = *ppEVar6;
        NamespaceAliasFromUnionType_abi_cxx11_
                  ((string *)local_1c0,this,(Namespace *)en_it._M_current[0x15],
                   &((EnumVal *)enum_name.field_2._8_8_)->union_type);
        EnumDef::ToString_abi_cxx11_
                  (&local_2a0,(EnumDef *)en_it._M_current,(EnumVal *)enum_name.field_2._8_8_);
        std::operator+(&local_280,"      case ",&local_2a0);
        std::operator+(&local_260,&local_280,": return ");
        std::operator+(&local_240,&local_260,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1c0);
        std::operator+(&local_220,&local_240,".reader.vTableGetNullable(_bc, _bcOffset, ");
        NumToString<unsigned_short>(&local_2c0,(s->value).offset);
        std::operator+(&local_200,&local_220,&local_2c0);
        std::operator+(&local_1e0,&local_200,");\n");
        std::__cxx11::string::operator+=((string *)it._M_current,(string *)&local_1e0);
        std::__cxx11::string::~string((string *)&local_1e0);
        std::__cxx11::string::~string((string *)&local_200);
        std::__cxx11::string::~string((string *)&local_2c0);
        std::__cxx11::string::~string((string *)&local_220);
        std::__cxx11::string::~string((string *)&local_240);
        std::__cxx11::string::~string((string *)&local_260);
        std::__cxx11::string::~string((string *)&local_280);
        std::__cxx11::string::~string((string *)&local_2a0);
        std::__cxx11::string::~string((string *)local_1c0);
        __gnu_cxx::
        __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
        ::operator++(&local_188);
      }
      std::__cxx11::string::operator+=((string *)it._M_current,"      default: return null;\n");
      std::__cxx11::string::operator+=((string *)it._M_current,"    }\n");
      std::__cxx11::string::operator+=((string *)it._M_current,"  }\n");
    }
    else {
      std::__cxx11::string::operator+=((string *)it._M_current," => ");
      if (((s->value).type.enum_def != (EnumDef *)0x0) &&
         ((s->value).type.base_type != BASE_TYPE_VECTOR)) {
        pNVar1 = (struct_def->super_Definition).defined_namespace;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_320,"",&local_321);
        GenDartTypeName(&local_300,this,&(s->value).type,pNVar1,s,&local_320);
        __rhs = ".fromValue(";
        if ((type_name.field_2._M_local_buf[0xb] & 1U) != 0) {
          __rhs = "._createOrNull(";
        }
        std::operator+(&local_2e0,&local_300,__rhs);
        std::__cxx11::string::operator+=((string *)it._M_current,(string *)&local_2e0);
        std::__cxx11::string::~string((string *)&local_2e0);
        std::__cxx11::string::~string((string *)&local_300);
        std::__cxx11::string::~string((string *)&local_320);
        std::allocator<char>::~allocator(&local_321);
      }
      GenReaderTypeName_abi_cxx11_
                (&local_348,this,&(s->value).type,(struct_def->super_Definition).defined_namespace,s
                 ,false,true,true);
      std::__cxx11::string::operator+=((string *)it._M_current,(string *)&local_348);
      std::__cxx11::string::~string((string *)&local_348);
      if ((struct_def->fixed & 1U) == 0) {
        std::__cxx11::string::operator+=((string *)it._M_current,".vTableGet");
        NumToString<unsigned_short>((string *)local_3c8,(s->value).offset);
        if ((type_name.field_2._M_local_buf[0xb] & 1U) == 0) {
          std::operator+(&local_488,"(_bc, _bcOffset, ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_3c8);
          std::operator+(&local_468,&local_488,", ");
          std::operator+(&local_448,&local_468,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_80);
          std::operator+(&local_428,&local_448,")");
          std::__cxx11::string::operator+=((string *)it._M_current,(string *)&local_428);
          std::__cxx11::string::~string((string *)&local_428);
          std::__cxx11::string::~string((string *)&local_448);
          std::__cxx11::string::~string((string *)&local_468);
          std::__cxx11::string::~string((string *)&local_488);
        }
        else {
          std::operator+(&local_408,"Nullable(_bc, _bcOffset, ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_3c8);
          std::operator+(&local_3e8,&local_408,")");
          std::__cxx11::string::operator+=((string *)it._M_current,(string *)&local_3e8);
          std::__cxx11::string::~string((string *)&local_3e8);
          std::__cxx11::string::~string((string *)&local_408);
        }
        std::__cxx11::string::~string((string *)local_3c8);
      }
      else {
        NumToString<unsigned_short>((string *)((long)&offset.field_2 + 8),(s->value).offset);
        std::operator+(&local_388,".read(_bc, _bcOffset + ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&offset.field_2 + 8));
        std::operator+(&local_368,&local_388,")");
        std::__cxx11::string::operator+=((string *)it._M_current,(string *)&local_368);
        std::__cxx11::string::~string((string *)&local_368);
        std::__cxx11::string::~string((string *)&local_388);
        std::__cxx11::string::~string((string *)(offset.field_2._M_local_buf + 8));
      }
      if (((s->value).type.enum_def != (EnumDef *)0x0) &&
         ((s->value).type.base_type != BASE_TYPE_VECTOR)) {
        std::__cxx11::string::operator+=((string *)it._M_current,")");
      }
      std::__cxx11::string::operator+=((string *)it._M_current,";\n");
    }
    std::__cxx11::string::~string((string *)local_b0);
    std::__cxx11::string::~string((string *)local_80);
    std::__cxx11::string::~string((string *)(defaultValue.field_2._M_local_buf + 8));
    __gnu_cxx::
    __normal_iterator<const_std::pair<int,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>_>
    ::operator++(&local_30);
  }
  std::__cxx11::string::operator+=((string *)it._M_current,"\n");
  IdlNamer::Type_abi_cxx11_(&local_4c8,&this->namer_,struct_def);
  GenToString(&local_4a8,this,&local_4c8,non_deprecated_fields);
  std::__cxx11::string::operator+=((string *)it._M_current,(string *)&local_4a8);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::__cxx11::string::~string((string *)&local_4c8);
  return;
}

Assistant:

void GenImplementationGetters(
      const StructDef &struct_def,
      const std::vector<std::pair<int, FieldDef *>> &non_deprecated_fields,
      std::string &code) {
    for (auto it = non_deprecated_fields.begin();
         it != non_deprecated_fields.end(); ++it) {
      const FieldDef &field = *it->second;

      const std::string field_name = namer_.Field(field);
      const std::string defaultValue = getDefaultValue(field.value);
      const bool isNullable = defaultValue.empty() && !struct_def.fixed;
      const std::string type_name =
          GenDartTypeName(field.value.type, struct_def.defined_namespace, field,
                          isNullable, "");

      GenDocComment(field.doc_comment, "  ", code);

      code += "  " + type_name + " get " + field_name;
      if (field.value.type.base_type == BASE_TYPE_UNION) {
        code += " {\n";
        code += "    switch (" + field_name + "Type?.value) {\n";
        const auto &enum_def = *field.value.type.enum_def;
        for (auto en_it = enum_def.Vals().begin() + 1;
             en_it != enum_def.Vals().end(); ++en_it) {
          const auto &ev = **en_it;
          const auto enum_name = NamespaceAliasFromUnionType(
              enum_def.defined_namespace, ev.union_type);
          code += "      case " + enum_def.ToString(ev) + ": return " +
                  enum_name + ".reader.vTableGetNullable(_bc, _bcOffset, " +
                  NumToString(field.value.offset) + ");\n";
        }
        code += "      default: return null;\n";
        code += "    }\n";
        code += "  }\n";
      } else {
        code += " => ";
        if (field.value.type.enum_def &&
            field.value.type.base_type != BASE_TYPE_VECTOR) {
          code += GenDartTypeName(field.value.type,
                                  struct_def.defined_namespace, field) +
                  (isNullable ? "._createOrNull(" : ".fromValue(");
        }

        code += GenReaderTypeName(field.value.type,
                                  struct_def.defined_namespace, field);
        if (struct_def.fixed) {
          code +=
              ".read(_bc, _bcOffset + " + NumToString(field.value.offset) + ")";
        } else {
          code += ".vTableGet";
          std::string offset = NumToString(field.value.offset);
          if (isNullable) {
            code += "Nullable(_bc, _bcOffset, " + offset + ")";
          } else {
            code += "(_bc, _bcOffset, " + offset + ", " + defaultValue + ")";
          }
        }
        if (field.value.type.enum_def &&
            field.value.type.base_type != BASE_TYPE_VECTOR) {
          code += ")";
        }
        code += ";\n";
      }
    }

    code += "\n";
    code += GenToString(namer_.Type(struct_def), non_deprecated_fields);
  }